

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

TraceLevel webrtc::anon_unknown_4::WebRtcSeverity(LoggingSeverity sev)

{
  TraceLevel local_c;
  LoggingSeverity sev_local;
  
  switch(sev) {
  case LS_SENSITIVE:
    local_c = kTraceInfo;
    break;
  case LS_VERBOSE:
    local_c = kTraceInfo;
    break;
  case LS_INFO:
    local_c = kTraceTerseInfo;
    break;
  case LS_WARNING:
    local_c = kTraceWarning;
    break;
  case LS_ERROR:
    local_c = kTraceError;
    break;
  default:
    local_c = kTraceNone;
  }
  return local_c;
}

Assistant:

TraceLevel WebRtcSeverity(LoggingSeverity sev) {
  switch (sev) {
    // TODO(ajm): SENSITIVE doesn't have a corresponding webrtc level.
    case LS_SENSITIVE:  return kTraceInfo;
    case LS_VERBOSE:    return kTraceInfo;
    case LS_INFO:       return kTraceTerseInfo;
    case LS_WARNING:    return kTraceWarning;
    case LS_ERROR:      return kTraceError;
    default:            return kTraceNone;
  }
}